

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

CollSeq * sqlite3BinaryCompareCollSeq(Parse *pParse,Expr *pLeft,Expr *pRight)

{
  CollSeq *pCVar1;
  Expr *pEVar2;
  
  pEVar2 = pLeft;
  if (((pLeft->flags & 0x200) == 0) &&
     (((pEVar2 = pRight, pRight == (Expr *)0x0 || ((pRight->flags & 0x200) == 0)) &&
      (pCVar1 = sqlite3ExprCollSeq(pParse,pLeft), pCVar1 != (CollSeq *)0x0)))) {
    return pCVar1;
  }
  pCVar1 = sqlite3ExprCollSeq(pParse,pEVar2);
  return pCVar1;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3BinaryCompareCollSeq(
  Parse *pParse,
  const Expr *pLeft,
  const Expr *pRight
){
  CollSeq *pColl;
  assert( pLeft );
  if( pLeft->flags & EP_Collate ){
    pColl = sqlite3ExprCollSeq(pParse, pLeft);
  }else if( pRight && (pRight->flags & EP_Collate)!=0 ){
    pColl = sqlite3ExprCollSeq(pParse, pRight);
  }else{
    pColl = sqlite3ExprCollSeq(pParse, pLeft);
    if( !pColl ){
      pColl = sqlite3ExprCollSeq(pParse, pRight);
    }
  }
  return pColl;
}